

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O0

void CreateBackwardReferencesNH65
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command_conflict *commands,
               size_t *num_commands,size_t *num_literals,
               BackwardReferenceFromDecoder *backward_references,size_t *back_refs_position,
               size_t back_refs_size)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  undefined4 uVar5;
  size_t sVar6;
  uint16_t *puVar7;
  uint32_t *puVar8;
  HasherCommon *pHVar9;
  Command_conflict *pCVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint32_t uVar15;
  int iVar16;
  uint8_t *puVar17;
  uint8_t *puVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  uint8_t *puVar23;
  BrotliTransforms *pBVar24;
  size_t sVar25;
  uint8_t *puVar26;
  long lVar27;
  byte bVar28;
  int *piVar29;
  uint8_t *puVar30;
  HROLLING *pHVar31;
  BrotliEncoderDictionary *pBVar32;
  bool bVar33;
  uint8_t *local_1518;
  uint8_t *local_1500;
  uint8_t *local_14e8;
  uint8_t *local_14e0;
  uint8_t *local_14d0;
  uint8_t *local_14b8;
  ulong local_14a0;
  uint8_t *local_1490;
  uint8_t *local_1488;
  ulong local_1480;
  ulong local_1478;
  ulong local_1470;
  uint8_t *local_1460;
  uint8_t *local_1458;
  uint8_t *local_1440;
  size_t pos_jump_1;
  size_t kMargin_1;
  size_t pos_jump;
  size_t kMargin;
  size_t range_end;
  size_t range_start;
  size_t distance_code;
  HasherSearchResult sr2;
  size_t cost_diff_lazy;
  size_t sStack_13b0;
  int delayed_backward_references_in_row;
  HasherSearchResult sr;
  size_t dictionary_start;
  size_t max_distance;
  size_t max_length;
  size_t kMinScore;
  size_t gap;
  size_t apply_random_heuristics;
  size_t random_heuristics_window_size;
  size_t store_end;
  size_t pos_end;
  size_t insert_length;
  Command_conflict *orig_commands;
  size_t position_offset;
  size_t max_backward_limit;
  H65 *privat;
  BrotliEncoderParams *params_local;
  ContextLut literal_context_lut_local;
  size_t ringbuffer_mask_local;
  uint8_t *ringbuffer_local;
  size_t position_local;
  size_t num_bytes_local;
  size_t offset1;
  size_t offset0;
  size_t distance_plus_3;
  ulong local_1218;
  uint32_t delta;
  size_t nbits;
  size_t offset_4;
  size_t prefix;
  size_t postfix;
  size_t postfix_mask;
  size_t bucket_2;
  size_t dist;
  uint16_t copycode;
  uint16_t inscode;
  uint32_t nbits_1;
  ushort local_1102;
  uint32_t nbits_2;
  ushort local_10da;
  uint32_t offset_5;
  uint16_t bits64;
  ushort local_10b2;
  size_t b_5;
  size_t a_5;
  size_t b_4;
  size_t a_4;
  size_t b_1;
  size_t a_1;
  size_t b;
  size_t a;
  int next_last_distance_1;
  int last_distance_1;
  int next_last_distance;
  int last_distance;
  size_t b_3;
  size_t a_3;
  size_t b_2;
  size_t a_2;
  int is_ok_1;
  size_t score_8;
  size_t len_6;
  size_t backward_7;
  size_t prev_ix_5;
  size_t down_1;
  uint32_t *bucket_1;
  ulong uStack_f30;
  uint32_t key_2;
  size_t score_7;
  size_t len_5;
  size_t prev_ix_4;
  size_t backward_6;
  size_t i_2;
  size_t best_len_1;
  size_t best_score_1;
  size_t min_score_1;
  size_t cur_ix_masked_2;
  uint32_t *buckets_1;
  uint16_t *num_1;
  size_t matching_bits_7;
  uint64_t x_7;
  size_t limit2_7;
  size_t matched_7;
  ulong *local_e40;
  size_t local_e30;
  size_t matching_bits_6;
  uint64_t x_6;
  size_t limit2_6;
  size_t matched_6;
  ulong *local_e00;
  size_t local_df0;
  ulong uStack_dc8;
  int item_matches_1;
  size_t i_3;
  size_t key_3;
  uint32_t h_3;
  size_t transform_id_1;
  size_t cut_1;
  size_t score_9;
  size_t backward_8;
  size_t matchlen_2;
  size_t offset_2;
  size_t matching_bits_8;
  uint64_t x_8;
  size_t limit2_8;
  size_t matched_8;
  ulong *local_c80;
  size_t local_c70;
  size_t score_6;
  size_t len_4;
  size_t prev_ix_3;
  size_t backward_5;
  size_t matching_bits_5;
  uint64_t x_5;
  size_t limit2_5;
  size_t matched_5;
  ulong *local_b98;
  size_t local_b88;
  size_t score_10;
  size_t matchlen_3;
  uint8_t *string_1;
  BrotliTransforms *transforms_1;
  uint8_t *word_1;
  int transform_idx_1;
  int word_idx_1;
  int mask_1;
  uint32_t shift_1;
  size_t offset_3;
  BrotliDictionary *words_1;
  int address_1;
  uint64_t h_2;
  int is_ok;
  size_t score_2;
  size_t len_2;
  size_t backward_2;
  size_t prev_ix_2;
  size_t down;
  uint32_t *bucket;
  ulong uStack_9b8;
  uint32_t key;
  size_t score_1;
  size_t len_1;
  size_t prev_ix_1;
  size_t backward_1;
  size_t i;
  size_t best_len;
  size_t best_score;
  size_t min_score;
  size_t cur_ix_masked;
  uint32_t *buckets;
  uint16_t *num;
  size_t matching_bits_2;
  uint64_t x_2;
  size_t limit2_2;
  size_t matched_2;
  ulong *local_8c8;
  size_t local_8b8;
  size_t matching_bits_1;
  uint64_t x_1;
  size_t limit2_1;
  size_t matched_1;
  ulong *local_888;
  size_t local_878;
  ulong uStack_850;
  int item_matches;
  size_t i_1;
  size_t key_1;
  uint32_t h_1;
  size_t transform_id;
  size_t cut;
  size_t score_3;
  size_t backward_3;
  size_t matchlen;
  size_t offset;
  size_t matching_bits_3;
  uint64_t x_3;
  size_t limit2_3;
  size_t matched_3;
  ulong *local_708;
  size_t local_6f8;
  size_t score;
  size_t len;
  size_t prev_ix;
  size_t backward;
  size_t matching_bits;
  uint64_t x;
  size_t limit2;
  size_t matched;
  ulong *local_620;
  size_t local_610;
  size_t score_4;
  size_t matchlen_1;
  uint8_t *string;
  BrotliTransforms *transforms;
  uint8_t *word;
  int transform_idx;
  int word_idx;
  int mask;
  uint32_t shift;
  size_t offset_1;
  BrotliDictionary *words;
  int address;
  uint64_t h;
  uint8_t *local_4c8;
  size_t i_4;
  size_t offset_6;
  size_t minor_ix;
  uint32_t key_4;
  uint32_t *buckets_2;
  uint16_t *num_2;
  uint64_t h_4;
  size_t offset_8;
  size_t minor_ix_2;
  uint32_t key_6;
  uint32_t *buckets_4;
  uint16_t *num_4;
  uint64_t h_6;
  size_t offset_7;
  size_t minor_ix_1;
  uint32_t key_5;
  uint32_t *buckets_3;
  uint16_t *num_3;
  uint64_t h_5;
  size_t score_5;
  size_t len_3;
  size_t found_ix_masked;
  size_t backward_4;
  size_t found_ix;
  uint8_t add;
  uint8_t rem;
  uint8_t *puStack_2b8;
  uint32_t code;
  size_t pos;
  size_t cur_ix_masked_1;
  size_t matching_bits_4;
  uint64_t x_4;
  size_t limit2_4;
  size_t matched_4;
  ulong *local_210;
  size_t local_200;
  size_t score_11;
  size_t len_7;
  size_t found_ix_masked_1;
  size_t backward_9;
  size_t found_ix_1;
  uint8_t add_1;
  uint8_t rem_1;
  uint8_t *puStack_190;
  uint32_t code_1;
  size_t pos_1;
  size_t cur_ix_masked_3;
  size_t matching_bits_9;
  uint64_t x_9;
  size_t limit2_9;
  size_t matched_9;
  ulong *local_e8;
  size_t local_d8;
  
  pCVar10 = commands;
  puVar17 = (uint8_t *)((1L << ((byte)params->lgwin & 0x3f)) - 0x10);
  sVar6 = params->stream_offset;
  pos_end = *last_insert_len;
  puVar18 = (uint8_t *)(position + num_bytes);
  local_1440 = (uint8_t *)position;
  if (7 < num_bytes) {
    local_1440 = (uint8_t *)((position + num_bytes) - 7);
  }
  iVar16 = 0x200;
  if (params->quality < 9) {
    iVar16 = 0x40;
  }
  lVar19 = (long)iVar16;
  gap = position + lVar19;
  iVar16 = (hasher->privat)._H6.num_last_distances_to_check_;
  puVar26 = (uint8_t *)position;
  if (4 < iVar16) {
    iVar12 = *dist_cache;
    dist_cache[4] = iVar12 + -1;
    dist_cache[5] = iVar12 + 1;
    dist_cache[6] = iVar12 + -2;
    dist_cache[7] = iVar12 + 2;
    dist_cache[8] = iVar12 + -3;
    dist_cache[9] = iVar12 + 3;
    puVar26 = (uint8_t *)position;
    if (10 < iVar16) {
      iVar16 = dist_cache[1];
      dist_cache[10] = iVar16 + -1;
      dist_cache[0xb] = iVar16 + 1;
      dist_cache[0xc] = iVar16 + -2;
      dist_cache[0xd] = iVar16 + 2;
      dist_cache[0xe] = iVar16 + -3;
      dist_cache[0xf] = iVar16 + 3;
      puVar26 = (uint8_t *)position;
    }
  }
LAB_0014fc36:
  do {
    ringbuffer_local = puVar26;
    if (puVar18 <= ringbuffer_local + 8) {
      *last_insert_len = (size_t)(puVar18 + (pos_end - (long)ringbuffer_local));
      *num_commands = ((long)commands - (long)pCVar10 >> 4) + *num_commands;
      return;
    }
    max_distance = (long)puVar18 - (long)ringbuffer_local;
    local_1458 = puVar17;
    if (ringbuffer_local < puVar17) {
      local_1458 = ringbuffer_local;
    }
    local_1460 = puVar17;
    if (ringbuffer_local + sVar6 < puVar17) {
      local_1460 = ringbuffer_local + sVar6;
    }
    sr.len = 0;
    sr.distance = 0x7e4;
    sr.score = 0;
    pBVar32 = &params->dictionary;
    puVar26 = (uint8_t *)(params->dist).max_distance;
    puVar7 = (hasher->privat)._H6.num_;
    puVar8 = (hasher->privat)._H6.buckets_;
    uVar20 = (ulong)ringbuffer_local & ringbuffer_mask;
    best_len = 0x7e4;
    i = 0;
    sStack_13b0 = 0;
    sr.score._0_4_ = 0;
    while( true ) {
      bVar33 = false;
      if (*back_refs_position < back_refs_size) {
        bVar33 = (uint8_t *)(long)backward_references[*back_refs_position].position <
                 ringbuffer_local;
      }
      if (!bVar33) break;
      *back_refs_position = *back_refs_position + 1;
    }
    if (((back_refs_size == 0) || (back_refs_size <= *back_refs_position)) ||
       ((uint8_t *)(long)backward_references[*back_refs_position].position != ringbuffer_local)) {
      for (backward_1 = 0;
          backward_1 < (ulong)(long)(hasher->privat)._H6.num_last_distances_to_check_;
          backward_1 = backward_1 + 1) {
        puVar30 = (uint8_t *)(long)dist_cache[backward_1];
        if (((ringbuffer_local + -(long)puVar30 < ringbuffer_local) && (puVar30 <= local_1458)) &&
           ((uVar21 = ringbuffer_mask & (ulong)(ringbuffer_local + -(long)puVar30),
            uVar20 + i <= ringbuffer_mask &&
            ((uVar21 + i <= ringbuffer_mask && (ringbuffer[uVar20 + i] == ringbuffer[uVar21 + i]))))
           )) {
          local_888 = (ulong *)(ringbuffer + uVar20);
          limit2_1 = 0;
          x_1 = (max_distance >> 3) + 1;
LAB_001505db:
          x_1 = x_1 - 1;
          if (x_1 != 0) {
            if (*local_888 == *(ulong *)(ringbuffer + limit2_1 + uVar21)) goto LAB_0015063d;
            iVar16 = 0;
            for (uVar21 = *local_888 ^ *(ulong *)(ringbuffer + limit2_1 + uVar21); (uVar21 & 1) == 0
                ; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
              iVar16 = iVar16 + 1;
            }
            local_878 = ((ulong)(long)iVar16 >> 3) + limit2_1;
            goto LAB_0015077e;
          }
          matched_1 = (max_distance & 7) + 1;
          while (matched_1 = matched_1 - 1, matched_1 != 0) {
            if (ringbuffer[limit2_1 + uVar21] != (uint8_t)*local_888) {
              local_878 = limit2_1;
              goto LAB_0015077e;
            }
            local_888 = (ulong *)((long)local_888 + 1);
            limit2_1 = limit2_1 + 1;
          }
          local_878 = limit2_1;
LAB_0015077e:
          score_1 = local_878;
          if (((back_refs_size != 0) && (*back_refs_position < back_refs_size)) &&
             ((uint8_t *)(long)backward_references[*back_refs_position].position <
              ringbuffer_local + local_878)) {
            score_1 = (long)backward_references[*back_refs_position].position -
                      (long)ringbuffer_local;
          }
          if (((2 < score_1) || ((score_1 == 2 && (backward_1 < 2)))) &&
             (uStack_9b8 = score_1 * 0x87 + 0x78f, best_len < uStack_9b8)) {
            if (backward_1 != 0) {
              uStack_9b8 = uStack_9b8 -
                           ((long)(int)(0x1ca10 >> ((byte)backward_1 & 0xe) & 0xe) + 0x27);
            }
            if (best_len < uStack_9b8) {
              best_len = uStack_9b8;
              i = score_1;
              sStack_13b0 = score_1;
              sr.distance = uStack_9b8;
              sr.len = (size_t)puVar30;
            }
          }
        }
      }
      uVar21 = (*(ulong *)(ringbuffer + uVar20) & (hasher->privat)._H6.hash_mask_) *
               0x1fe35a7bd3579bd3 >> ((byte)(hasher->privat)._H35.hb.state & 0x3f);
      uVar14 = (int)uVar21 <<
               ((byte)*(undefined4 *)((long)&(hasher->privat)._H35.hb.next_ix + 4) & 0x1f);
      if ((hasher->privat)._H2.buckets_ < (uint32_t *)(ulong)puVar7[uVar21 & 0xffffffff]) {
        local_1470 = (ulong)puVar7[uVar21 & 0xffffffff] - (hasher->privat)._H5.block_size_;
      }
      else {
        local_1470 = 0;
      }
      backward_1 = (size_t)puVar7[uVar21 & 0xffffffff];
      while (local_1470 < backward_1) {
        backward_1 = backward_1 - 1;
        uVar22 = (ulong)puVar8[(ulong)uVar14 + (backward_1 & (hasher->privat)._H6.block_mask_)];
        puVar30 = ringbuffer_local + -uVar22;
        if (local_1458 < puVar30) break;
        uVar22 = ringbuffer_mask & uVar22;
        if (((uVar20 + i <= ringbuffer_mask) && (uVar22 + i <= ringbuffer_mask)) &&
           (ringbuffer[uVar20 + i] == ringbuffer[uVar22 + i])) {
          local_8c8 = (ulong *)(ringbuffer + uVar20);
          limit2_2 = 0;
          x_2 = (max_distance >> 3) + 1;
LAB_00150b95:
          x_2 = x_2 - 1;
          if (x_2 != 0) {
            if (*local_8c8 == *(ulong *)(ringbuffer + limit2_2 + uVar22)) goto LAB_00150bf7;
            iVar16 = 0;
            for (uVar22 = *local_8c8 ^ *(ulong *)(ringbuffer + limit2_2 + uVar22); (uVar22 & 1) == 0
                ; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
              iVar16 = iVar16 + 1;
            }
            local_8b8 = ((ulong)(long)iVar16 >> 3) + limit2_2;
            goto LAB_00150d38;
          }
          matched_2 = (max_distance & 7) + 1;
          while (matched_2 = matched_2 - 1, matched_2 != 0) {
            if (ringbuffer[limit2_2 + uVar22] != (uint8_t)*local_8c8) {
              local_8b8 = limit2_2;
              goto LAB_00150d38;
            }
            local_8c8 = (ulong *)((long)local_8c8 + 1);
            limit2_2 = limit2_2 + 1;
          }
          local_8b8 = limit2_2;
LAB_00150d38:
          score_2 = local_8b8;
          if (((back_refs_size != 0) && (*back_refs_position < back_refs_size)) &&
             ((uint8_t *)(long)backward_references[*back_refs_position].position <
              ringbuffer_local + local_8b8)) {
            score_2 = (long)backward_references[*back_refs_position].position -
                      (long)ringbuffer_local;
          }
          if (3 < score_2) {
            iVar16 = 0x1f;
            if ((uint)puVar30 != 0) {
              for (; (uint)puVar30 >> iVar16 == 0; iVar16 = iVar16 + -1) {
              }
            }
            uVar22 = (score_2 * 0x87 + 0x780) - (ulong)(uint)(iVar16 * 0x1e);
            if (best_len < uVar22) {
              i = score_2;
              sStack_13b0 = score_2;
              sr.len = (size_t)puVar30;
              sr.distance = uVar22;
              best_len = uVar22;
            }
          }
        }
      }
      puVar8[(ulong)uVar14 +
             (ulong)((uint)puVar7[uVar21 & 0xffffffff] & (hasher->privat)._H6.block_mask_)] =
           (uint32_t)ringbuffer_local;
      puVar7[uVar21 & 0xffffffff] = puVar7[uVar21 & 0xffffffff] + 1;
LAB_00150ed3:
      if (sr.distance == 0x7e4) {
        if (back_refs_size == 0) {
          pHVar9 = (hasher->privat)._H6.common_;
          piVar29 = (int *)(ringbuffer + uVar20);
          if (pHVar9->dict_num_lookups >> 7 <= pHVar9->dict_num_matches) {
            i_1 = (size_t)(((uint)(*piVar29 * 0x1e35a7bd) >> 0x12) << 1);
            for (uStack_850 = 0; uStack_850 < 2; uStack_850 = uStack_850 + 1) {
              pHVar9->dict_num_lookups = pHVar9->dict_num_lookups + 1;
              if ((params->dictionary).hash_table_lengths[i_1] != '\0') {
                bVar1 = (params->dictionary).hash_table_lengths[i_1];
                uVar21 = (ulong)bVar1;
                uVar20 = (ulong)(params->dictionary).hash_table_words[i_1];
                if (max_distance < uVar21) {
                  bVar33 = false;
                }
                else {
                  local_708 = (ulong *)(pBVar32->words->data +
                                       (ulong)pBVar32->words->offsets_by_length[uVar21] +
                                       uVar21 * uVar20);
                  limit2_3 = 0;
                  x_3 = (ulong)(bVar1 >> 3) + 1;
LAB_00151179:
                  x_3 = x_3 - 1;
                  if (x_3 != 0) {
                    if (*local_708 == *(ulong *)((long)piVar29 + limit2_3)) goto LAB_001511db;
                    iVar16 = 0;
                    for (uVar22 = *local_708 ^ *(ulong *)((long)piVar29 + limit2_3);
                        (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                      iVar16 = iVar16 + 1;
                    }
                    local_6f8 = ((ulong)(long)iVar16 >> 3) + limit2_3;
                    goto LAB_0015131c;
                  }
                  matched_3 = (uVar21 & 7) + 1;
                  while (matched_3 = matched_3 - 1, matched_3 != 0) {
                    if (*(char *)((long)piVar29 + limit2_3) != (char)*local_708) {
                      local_6f8 = limit2_3;
                      goto LAB_0015131c;
                    }
                    local_708 = (ulong *)((long)local_708 + 1);
                    limit2_3 = limit2_3 + 1;
                  }
                  local_6f8 = limit2_3;
LAB_0015131c:
                  if ((uVar21 < local_6f8 + (params->dictionary).cutoffTransformsCount) &&
                     (local_6f8 != 0)) {
                    puVar30 = local_1460 +
                              ((uVar21 - local_6f8) * 4 +
                               ((params->dictionary).cutoffTransforms >>
                                ((char)(uVar21 - local_6f8) * '\x06' & 0x3fU) & 0x3f) <<
                              (pBVar32->words->size_bits_by_length[uVar21] & 0x3f)) + uVar20 + 1;
                    if (puVar26 < puVar30) {
                      bVar33 = false;
                    }
                    else {
                      iVar16 = 0x1f;
                      if ((uint)puVar30 != 0) {
                        for (; (uint)puVar30 >> iVar16 == 0; iVar16 = iVar16 + -1) {
                        }
                      }
                      uVar20 = (local_6f8 * 0x87 + 0x780) - (ulong)(uint)(iVar16 * 0x1e);
                      if (uVar20 < sr.distance) {
                        bVar33 = false;
                      }
                      else {
                        sStack_13b0 = local_6f8;
                        sr.score._0_4_ = (uint)bVar1 - (int)local_6f8;
                        bVar33 = true;
                        sr.len = (size_t)puVar30;
                        sr.distance = uVar20;
                      }
                    }
                  }
                  else {
                    bVar33 = false;
                  }
                }
                if (bVar33) {
                  pHVar9->dict_num_matches = pHVar9->dict_num_matches + 1;
                }
              }
              i_1 = i_1 + 1;
            }
          }
        }
        else if (((*back_refs_position < back_refs_size) &&
                 ((uint8_t *)(long)backward_references[*back_refs_position].position ==
                  ringbuffer_local)) &&
                (backward_references[*back_refs_position].max_distance <
                 backward_references[*back_refs_position].distance)) {
          uVar14 = backward_references[*back_refs_position].distance;
          iVar16 = backward_references[*back_refs_position].copy_len;
          if ((((int)uVar14 < 0x7ffffffd) && (3 < iVar16)) && (iVar16 < 0x19)) {
            uVar11 = (uVar14 - (int)local_1458) - 1;
            uVar4 = pBVar32->words->offsets_by_length[iVar16];
            bVar1 = pBVar32->words->size_bits_by_length[iVar16];
            uVar3 = kBitMask[bVar1];
            iVar12 = (int)uVar11 >> (bVar1 & 0x1f);
            if (iVar12 < (int)(params->dictionary).num_transforms) {
              puVar26 = pBVar32->words->data;
              pBVar24 = BrotliGetTransforms();
              puVar30 = (uint8_t *)malloc((long)iVar16 * 10);
              iVar12 = BrotliTransformDictionaryWord
                                 (puVar30,puVar26 + (long)(int)((uVar11 & uVar3) * iVar16) +
                                                    (ulong)uVar4,iVar16,pBVar24,iVar12);
              sVar25 = (size_t)iVar12;
              iVar13 = memcmp(ringbuffer + uVar20,puVar30,sVar25);
              if (iVar13 == 0) {
                iVar13 = 0x1f;
                if (uVar14 != 0) {
                  for (; uVar14 >> iVar13 == 0; iVar13 = iVar13 + -1) {
                  }
                }
                sr.distance = (sVar25 * 0x87 + 0x780) - (ulong)(uint)(iVar13 * 0x1e);
                sr.score._0_4_ = iVar16 - iVar12;
                sr.len = (size_t)(int)uVar14;
                sStack_13b0 = sVar25;
              }
            }
          }
        }
      }
    }
    else {
      uVar14 = backward_references[*back_refs_position].distance;
      uVar21 = (ulong)(int)uVar14;
      if ((ringbuffer_local + -uVar21 < ringbuffer_local) &&
         (uVar21 <= (ulong)(long)backward_references[*back_refs_position].max_distance)) {
        uVar22 = ringbuffer_mask & (ulong)(ringbuffer_local + -uVar21);
        local_620 = (ulong *)(ringbuffer + uVar20);
        limit2 = 0;
        x = (max_distance >> 3) + 1;
LAB_001501cf:
        x = x - 1;
        if (x != 0) {
          if (*local_620 == *(ulong *)(ringbuffer + limit2 + uVar22)) goto LAB_00150231;
          iVar16 = 0;
          for (uVar22 = *local_620 ^ *(ulong *)(ringbuffer + limit2 + uVar22); (uVar22 & 1) == 0;
              uVar22 = uVar22 >> 1 | 0x8000000000000000) {
            iVar16 = iVar16 + 1;
          }
          local_610 = ((ulong)(long)iVar16 >> 3) + limit2;
          goto LAB_00150372;
        }
        matched = (max_distance & 7) + 1;
        while (matched = matched - 1, matched != 0) {
          if (ringbuffer[limit2 + uVar22] != (uint8_t)*local_620) {
            local_610 = limit2;
            goto LAB_00150372;
          }
          local_620 = (ulong *)((long)local_620 + 1);
          limit2 = limit2 + 1;
        }
        local_610 = limit2;
LAB_00150372:
        score = local_610;
        if ((ulong)(long)backward_references[*back_refs_position].copy_len < local_610) {
          score = (size_t)backward_references[*back_refs_position].copy_len;
        }
        iVar16 = 0x1f;
        if (uVar14 != 0) {
          for (; uVar14 >> iVar16 == 0; iVar16 = iVar16 + -1) {
          }
        }
        sr.distance = (score * 0x87 + 0x780) - (ulong)(uint)(iVar16 * 0x1e);
        sStack_13b0 = score;
        sr.len = uVar21;
      }
      if (sr.score._4_4_ == 0) goto LAB_00150ed3;
    }
    pHVar31 = &(hasher->privat)._H65.hb;
    if (0x1f < max_distance) {
      for (puStack_2b8 = *(uint8_t **)&(hasher->privat)._H35.hb_common.params.block_bits;
          puStack_2b8 <= ringbuffer_local; puStack_2b8 = puStack_2b8 + 1) {
        uVar14 = pHVar31->state & 0x3fffffff;
        uVar15 = HashRollingFunctionHROLLING
                           (pHVar31->state,ringbuffer[(ulong)(puStack_2b8 + 0x20) & ringbuffer_mask]
                            ,ringbuffer[(ulong)puStack_2b8 & ringbuffer_mask],
                            (hasher->privat)._H65.hb.factor,(hasher->privat)._H65.hb.factor_remove);
        pHVar31->state = uVar15;
        if (uVar14 < 0x1000000) {
          uVar4 = *(uint *)(*(long *)&(hasher->privat)._H35.hb_common.params + (ulong)uVar14 * 4);
          *(int *)(*(long *)&(hasher->privat)._H35.hb_common.params + (ulong)uVar14 * 4) =
               (int)puStack_2b8;
          if ((puStack_2b8 == ringbuffer_local) && ((ulong)uVar4 != 0xffffffff)) {
            uVar14 = (uint32_t)ringbuffer_local - uVar4;
            if ((uint8_t *)(ulong)uVar14 <= local_1458) {
              uVar20 = uVar4 & ringbuffer_mask;
              local_210 = (ulong *)(ringbuffer + ((ulong)ringbuffer_local & ringbuffer_mask));
              limit2_4 = 0;
              x_4 = (max_distance >> 3) + 1;
LAB_00151bab:
              x_4 = x_4 - 1;
              if (x_4 != 0) {
                if (*local_210 == *(ulong *)(ringbuffer + limit2_4 + uVar20)) goto LAB_00151c0d;
                iVar16 = 0;
                for (uVar20 = *local_210 ^ *(ulong *)(ringbuffer + limit2_4 + uVar20);
                    (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
                  iVar16 = iVar16 + 1;
                }
                local_200 = ((ulong)(long)iVar16 >> 3) + limit2_4;
                goto LAB_00151d4e;
              }
              matched_4 = (max_distance & 7) + 1;
              while (matched_4 = matched_4 - 1, matched_4 != 0) {
                if (ringbuffer[limit2_4 + uVar20] != (uint8_t)*local_210) {
                  local_200 = limit2_4;
                  goto LAB_00151d4e;
                }
                local_210 = (ulong *)((long)local_210 + 1);
                limit2_4 = limit2_4 + 1;
              }
              local_200 = limit2_4;
LAB_00151d4e:
              if ((3 < local_200) && (sStack_13b0 < local_200)) {
                iVar16 = 0x1f;
                if (uVar14 != 0) {
                  for (; uVar14 >> iVar16 == 0; iVar16 = iVar16 + -1) {
                  }
                }
                uVar20 = (local_200 * 0x87 + 0x780) - (ulong)(uint)(iVar16 * 0x1e);
                if (sr.distance < uVar20) {
                  sStack_13b0 = local_200;
                  sr.score._0_4_ = 0;
                  sr.len = (size_t)(ulong)uVar14;
                  sr.distance = uVar20;
                }
              }
            }
          }
        }
      }
      *(uint8_t **)&(hasher->privat)._H35.hb_common.params.block_bits = ringbuffer_local + 1;
    }
    if (0x7e4 < sr.distance) {
      cost_diff_lazy._4_4_ = 0;
      puVar26 = ringbuffer_local;
      if (sr.score._4_4_ == 0) {
        do {
          max_distance = max_distance - 1;
          if (params->quality < 5) {
            local_1478 = sStack_13b0 - 1;
            if (max_distance <= local_1478) {
              local_1478 = max_distance;
            }
            local_1480 = local_1478;
          }
          else {
            local_1480 = 0;
          }
          sr2.len = 0;
          sr2.distance = 0x7e4;
          sr2.score._4_4_ = 0;
          local_1488 = puVar17;
          if (ringbuffer_local + 1 < puVar17) {
            local_1488 = ringbuffer_local + 1;
          }
          local_1490 = puVar17;
          if (ringbuffer_local + sVar6 + 1 < puVar17) {
            local_1490 = ringbuffer_local + sVar6 + 1;
          }
          pBVar32 = &params->dictionary;
          puVar30 = ringbuffer_local + 1;
          puVar26 = (uint8_t *)(params->dist).max_distance;
          puVar7 = (hasher->privat)._H6.num_;
          puVar8 = (hasher->privat)._H6.buckets_;
          uVar20 = (ulong)puVar30 & ringbuffer_mask;
          best_len_1 = 0x7e4;
          i_2 = local_1480;
          distance_code = 0;
          sr2.score._0_4_ = 0;
          while( true ) {
            bVar33 = false;
            if (*back_refs_position < back_refs_size) {
              bVar33 = (uint8_t *)(long)backward_references[*back_refs_position].position < puVar30;
            }
            if (!bVar33) break;
            *back_refs_position = *back_refs_position + 1;
          }
          if (((back_refs_size == 0) || (back_refs_size <= *back_refs_position)) ||
             ((uint8_t *)(long)backward_references[*back_refs_position].position != puVar30)) {
            for (backward_6 = 0;
                backward_6 < (ulong)(long)(hasher->privat)._H6.num_last_distances_to_check_;
                backward_6 = backward_6 + 1) {
              puVar23 = (uint8_t *)(long)dist_cache[backward_6];
              if (((puVar30 + -(long)puVar23 < puVar30) && (puVar23 <= local_1488)) &&
                 ((uVar21 = ringbuffer_mask & (ulong)(puVar30 + -(long)puVar23),
                  uVar20 + i_2 <= ringbuffer_mask &&
                  ((uVar21 + i_2 <= ringbuffer_mask &&
                   (ringbuffer[uVar20 + i_2] == ringbuffer[uVar21 + i_2])))))) {
                local_e00 = (ulong *)(ringbuffer + uVar20);
                limit2_6 = 0;
                x_6 = (max_distance >> 3) + 1;
LAB_00152853:
                x_6 = x_6 - 1;
                if (x_6 != 0) {
                  if (*local_e00 == *(ulong *)(ringbuffer + limit2_6 + uVar21)) goto LAB_001528b5;
                  iVar16 = 0;
                  for (uVar21 = *local_e00 ^ *(ulong *)(ringbuffer + limit2_6 + uVar21);
                      (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
                    iVar16 = iVar16 + 1;
                  }
                  local_df0 = ((ulong)(long)iVar16 >> 3) + limit2_6;
                  goto LAB_001529f6;
                }
                matched_6 = (max_distance & 7) + 1;
                while (matched_6 = matched_6 - 1, matched_6 != 0) {
                  if (ringbuffer[limit2_6 + uVar21] != (uint8_t)*local_e00) {
                    local_df0 = limit2_6;
                    goto LAB_001529f6;
                  }
                  local_e00 = (ulong *)((long)local_e00 + 1);
                  limit2_6 = limit2_6 + 1;
                }
                local_df0 = limit2_6;
LAB_001529f6:
                score_7 = local_df0;
                if (((back_refs_size != 0) && (*back_refs_position < back_refs_size)) &&
                   ((uint8_t *)(long)backward_references[*back_refs_position].position <
                    puVar30 + local_df0)) {
                  score_7 = (long)backward_references[*back_refs_position].position - (long)puVar30;
                }
                if (((2 < score_7) || ((score_7 == 2 && (backward_6 < 2)))) &&
                   (uStack_f30 = score_7 * 0x87 + 0x78f, best_len_1 < uStack_f30)) {
                  if (backward_6 != 0) {
                    uStack_f30 = uStack_f30 -
                                 ((long)(int)(0x1ca10 >> ((byte)backward_6 & 0xe) & 0xe) + 0x27);
                  }
                  if (best_len_1 < uStack_f30) {
                    best_len_1 = uStack_f30;
                    i_2 = score_7;
                    distance_code = score_7;
                    sr2.distance = uStack_f30;
                    sr2.len = (size_t)puVar23;
                  }
                }
              }
            }
            uVar21 = (*(ulong *)(ringbuffer + uVar20) & (hasher->privat)._H6.hash_mask_) *
                     0x1fe35a7bd3579bd3 >> ((byte)(hasher->privat)._H35.hb.state & 0x3f);
            uVar14 = (int)uVar21 <<
                     ((byte)*(undefined4 *)((long)&(hasher->privat)._H35.hb.next_ix + 4) & 0x1f);
            if ((hasher->privat)._H2.buckets_ < (uint32_t *)(ulong)puVar7[uVar21 & 0xffffffff]) {
              local_14a0 = (ulong)puVar7[uVar21 & 0xffffffff] - (hasher->privat)._H5.block_size_;
            }
            else {
              local_14a0 = 0;
            }
            backward_6 = (size_t)puVar7[uVar21 & 0xffffffff];
            while (local_14a0 < backward_6) {
              backward_6 = backward_6 - 1;
              uVar22 = (ulong)puVar8[(ulong)uVar14 + (backward_6 & (hasher->privat)._H6.block_mask_)
                                    ];
              puVar23 = puVar30 + -uVar22;
              if (local_1488 < puVar23) break;
              uVar22 = ringbuffer_mask & uVar22;
              if (((uVar20 + i_2 <= ringbuffer_mask) && (uVar22 + i_2 <= ringbuffer_mask)) &&
                 (ringbuffer[uVar20 + i_2] == ringbuffer[uVar22 + i_2])) {
                local_e40 = (ulong *)(ringbuffer + uVar20);
                limit2_7 = 0;
                x_7 = (max_distance >> 3) + 1;
LAB_00152e0d:
                x_7 = x_7 - 1;
                if (x_7 != 0) {
                  if (*local_e40 == *(ulong *)(ringbuffer + limit2_7 + uVar22)) goto LAB_00152e6f;
                  iVar16 = 0;
                  for (uVar22 = *local_e40 ^ *(ulong *)(ringbuffer + limit2_7 + uVar22);
                      (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                    iVar16 = iVar16 + 1;
                  }
                  local_e30 = ((ulong)(long)iVar16 >> 3) + limit2_7;
                  goto LAB_00152fb0;
                }
                matched_7 = (max_distance & 7) + 1;
                while (matched_7 = matched_7 - 1, matched_7 != 0) {
                  if (ringbuffer[limit2_7 + uVar22] != (uint8_t)*local_e40) {
                    local_e30 = limit2_7;
                    goto LAB_00152fb0;
                  }
                  local_e40 = (ulong *)((long)local_e40 + 1);
                  limit2_7 = limit2_7 + 1;
                }
                local_e30 = limit2_7;
LAB_00152fb0:
                score_8 = local_e30;
                if (((back_refs_size != 0) && (*back_refs_position < back_refs_size)) &&
                   ((uint8_t *)(long)backward_references[*back_refs_position].position <
                    puVar30 + local_e30)) {
                  score_8 = (long)backward_references[*back_refs_position].position - (long)puVar30;
                }
                if (3 < score_8) {
                  iVar16 = 0x1f;
                  if ((uint)puVar23 != 0) {
                    for (; (uint)puVar23 >> iVar16 == 0; iVar16 = iVar16 + -1) {
                    }
                  }
                  uVar22 = (score_8 * 0x87 + 0x780) - (ulong)(uint)(iVar16 * 0x1e);
                  if (best_len_1 < uVar22) {
                    i_2 = score_8;
                    distance_code = score_8;
                    sr2.len = (size_t)puVar23;
                    sr2.distance = uVar22;
                    best_len_1 = uVar22;
                  }
                }
              }
            }
            puVar8[(ulong)uVar14 +
                   (ulong)((uint)puVar7[uVar21 & 0xffffffff] & (hasher->privat)._H6.block_mask_)] =
                 (uint32_t)puVar30;
            puVar7[uVar21 & 0xffffffff] = puVar7[uVar21 & 0xffffffff] + 1;
LAB_0015314b:
            if (sr2.distance == 0x7e4) {
              if (back_refs_size == 0) {
                pHVar9 = (hasher->privat)._H6.common_;
                piVar29 = (int *)(ringbuffer + uVar20);
                if (pHVar9->dict_num_lookups >> 7 <= pHVar9->dict_num_matches) {
                  i_3 = (size_t)(((uint)(*piVar29 * 0x1e35a7bd) >> 0x12) << 1);
                  for (uStack_dc8 = 0; uStack_dc8 < 2; uStack_dc8 = uStack_dc8 + 1) {
                    pHVar9->dict_num_lookups = pHVar9->dict_num_lookups + 1;
                    if ((params->dictionary).hash_table_lengths[i_3] != '\0') {
                      bVar1 = (params->dictionary).hash_table_lengths[i_3];
                      uVar21 = (ulong)bVar1;
                      uVar20 = (ulong)(params->dictionary).hash_table_words[i_3];
                      if (max_distance < uVar21) {
                        bVar33 = false;
                      }
                      else {
                        local_c80 = (ulong *)(pBVar32->words->data +
                                             (ulong)pBVar32->words->offsets_by_length[uVar21] +
                                             uVar21 * uVar20);
                        limit2_8 = 0;
                        x_8 = (ulong)(bVar1 >> 3) + 1;
LAB_001533f1:
                        x_8 = x_8 - 1;
                        if (x_8 != 0) {
                          if (*local_c80 == *(ulong *)((long)piVar29 + limit2_8)) goto LAB_00153453;
                          iVar16 = 0;
                          for (uVar22 = *local_c80 ^ *(ulong *)((long)piVar29 + limit2_8);
                              (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                            iVar16 = iVar16 + 1;
                          }
                          local_c70 = ((ulong)(long)iVar16 >> 3) + limit2_8;
                          goto LAB_00153594;
                        }
                        matched_8 = (uVar21 & 7) + 1;
                        while (matched_8 = matched_8 - 1, matched_8 != 0) {
                          if (*(char *)((long)piVar29 + limit2_8) != (char)*local_c80) {
                            local_c70 = limit2_8;
                            goto LAB_00153594;
                          }
                          local_c80 = (ulong *)((long)local_c80 + 1);
                          limit2_8 = limit2_8 + 1;
                        }
                        local_c70 = limit2_8;
LAB_00153594:
                        if ((uVar21 < local_c70 + (params->dictionary).cutoffTransformsCount) &&
                           (local_c70 != 0)) {
                          puVar23 = local_1490 +
                                    ((uVar21 - local_c70) * 4 +
                                     ((params->dictionary).cutoffTransforms >>
                                      ((char)(uVar21 - local_c70) * '\x06' & 0x3fU) & 0x3f) <<
                                    (pBVar32->words->size_bits_by_length[uVar21] & 0x3f)) +
                                    uVar20 + 1;
                          if (puVar26 < puVar23) {
                            bVar33 = false;
                          }
                          else {
                            iVar16 = 0x1f;
                            if ((uint)puVar23 != 0) {
                              for (; (uint)puVar23 >> iVar16 == 0; iVar16 = iVar16 + -1) {
                              }
                            }
                            uVar20 = (local_c70 * 0x87 + 0x780) - (ulong)(uint)(iVar16 * 0x1e);
                            if (uVar20 < sr2.distance) {
                              bVar33 = false;
                            }
                            else {
                              distance_code = local_c70;
                              sr2.score._0_4_ = (uint)bVar1 - (int)local_c70;
                              bVar33 = true;
                              sr2.len = (size_t)puVar23;
                              sr2.distance = uVar20;
                            }
                          }
                        }
                        else {
                          bVar33 = false;
                        }
                      }
                      if (bVar33) {
                        pHVar9->dict_num_matches = pHVar9->dict_num_matches + 1;
                      }
                    }
                    i_3 = i_3 + 1;
                  }
                }
              }
              else if (((*back_refs_position < back_refs_size) &&
                       ((uint8_t *)(long)backward_references[*back_refs_position].position ==
                        puVar30)) &&
                      (backward_references[*back_refs_position].max_distance <
                       backward_references[*back_refs_position].distance)) {
                uVar14 = backward_references[*back_refs_position].distance;
                iVar16 = backward_references[*back_refs_position].copy_len;
                if ((((int)uVar14 < 0x7ffffffd) && (3 < iVar16)) && (iVar16 < 0x19)) {
                  uVar11 = (uVar14 - (int)local_1488) - 1;
                  uVar4 = pBVar32->words->offsets_by_length[iVar16];
                  bVar1 = pBVar32->words->size_bits_by_length[iVar16];
                  uVar3 = kBitMask[bVar1];
                  iVar12 = (int)uVar11 >> (bVar1 & 0x1f);
                  if (iVar12 < (int)(params->dictionary).num_transforms) {
                    puVar26 = pBVar32->words->data;
                    pBVar24 = BrotliGetTransforms();
                    puVar23 = (uint8_t *)malloc((long)iVar16 * 10);
                    iVar12 = BrotliTransformDictionaryWord
                                       (puVar23,puVar26 + (long)(int)((uVar11 & uVar3) * iVar16) +
                                                          (ulong)uVar4,iVar16,pBVar24,iVar12);
                    sVar25 = (size_t)iVar12;
                    iVar13 = memcmp(ringbuffer + uVar20,puVar23,sVar25);
                    if (iVar13 == 0) {
                      iVar13 = 0x1f;
                      if (uVar14 != 0) {
                        for (; uVar14 >> iVar13 == 0; iVar13 = iVar13 + -1) {
                        }
                      }
                      sr2.distance = (sVar25 * 0x87 + 0x780) - (ulong)(uint)(iVar13 * 0x1e);
                      sr2.score._0_4_ = iVar16 - iVar12;
                      sr2.len = (size_t)(int)uVar14;
                      distance_code = sVar25;
                    }
                  }
                }
                sr2.score._4_4_ = 1;
              }
            }
          }
          else {
            uVar14 = backward_references[*back_refs_position].distance;
            uVar21 = (ulong)(int)uVar14;
            if ((puVar30 + -uVar21 < puVar30) &&
               (uVar21 <= (ulong)(long)backward_references[*back_refs_position].max_distance)) {
              uVar22 = ringbuffer_mask & (ulong)(puVar30 + -uVar21);
              local_b98 = (ulong *)(ringbuffer + uVar20);
              limit2_5 = 0;
              x_5 = (max_distance >> 3) + 1;
LAB_00152447:
              x_5 = x_5 - 1;
              if (x_5 != 0) {
                if (*local_b98 == *(ulong *)(ringbuffer + limit2_5 + uVar22)) goto LAB_001524a9;
                iVar16 = 0;
                for (uVar22 = *local_b98 ^ *(ulong *)(ringbuffer + limit2_5 + uVar22);
                    (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                  iVar16 = iVar16 + 1;
                }
                local_b88 = ((ulong)(long)iVar16 >> 3) + limit2_5;
                goto LAB_001525ea;
              }
              matched_5 = (max_distance & 7) + 1;
              while (matched_5 = matched_5 - 1, matched_5 != 0) {
                if (ringbuffer[limit2_5 + uVar22] != (uint8_t)*local_b98) {
                  local_b88 = limit2_5;
                  goto LAB_001525ea;
                }
                local_b98 = (ulong *)((long)local_b98 + 1);
                limit2_5 = limit2_5 + 1;
              }
              local_b88 = limit2_5;
LAB_001525ea:
              score_6 = local_b88;
              if ((ulong)(long)backward_references[*back_refs_position].copy_len < local_b88) {
                score_6 = (size_t)backward_references[*back_refs_position].copy_len;
              }
              iVar16 = 0x1f;
              if (uVar14 != 0) {
                for (; uVar14 >> iVar16 == 0; iVar16 = iVar16 + -1) {
                }
              }
              sr2.distance = (score_6 * 0x87 + 0x780) - (ulong)(uint)(iVar16 * 0x1e);
              distance_code = score_6;
              sr2.score._4_4_ = 1;
              sr2.len = uVar21;
            }
            if (sr2.score._4_4_ == 0) goto LAB_0015314b;
          }
          pHVar31 = &(hasher->privat)._H65.hb;
          if (0x1f < max_distance) {
            for (puStack_190 = *(uint8_t **)&(hasher->privat)._H35.hb_common.params.block_bits;
                puStack_190 <= puVar30; puStack_190 = puStack_190 + 1) {
              uVar14 = pHVar31->state & 0x3fffffff;
              uVar15 = HashRollingFunctionHROLLING
                                 (pHVar31->state,
                                  ringbuffer[(ulong)(puStack_190 + 0x20) & ringbuffer_mask],
                                  ringbuffer[(ulong)puStack_190 & ringbuffer_mask],
                                  (hasher->privat)._H65.hb.factor,
                                  (hasher->privat)._H65.hb.factor_remove);
              pHVar31->state = uVar15;
              if (uVar14 < 0x1000000) {
                uVar4 = *(uint *)(*(long *)&(hasher->privat)._H35.hb_common.params +
                                 (ulong)uVar14 * 4);
                *(int *)(*(long *)&(hasher->privat)._H35.hb_common.params + (ulong)uVar14 * 4) =
                     (int)puStack_190;
                if ((puStack_190 == puVar30) && ((ulong)uVar4 != 0xffffffff)) {
                  uVar14 = (uint32_t)puVar30 - uVar4;
                  if ((uint8_t *)(ulong)uVar14 <= local_1488) {
                    uVar20 = uVar4 & ringbuffer_mask;
                    local_e8 = (ulong *)(ringbuffer + ((ulong)puVar30 & ringbuffer_mask));
                    limit2_9 = 0;
                    x_9 = (max_distance >> 3) + 1;
LAB_00153e23:
                    x_9 = x_9 - 1;
                    if (x_9 != 0) {
                      if (*local_e8 == *(ulong *)(ringbuffer + limit2_9 + uVar20))
                      goto LAB_00153e85;
                      iVar16 = 0;
                      for (uVar20 = *local_e8 ^ *(ulong *)(ringbuffer + limit2_9 + uVar20);
                          (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
                        iVar16 = iVar16 + 1;
                      }
                      local_d8 = ((ulong)(long)iVar16 >> 3) + limit2_9;
                      goto LAB_00153fc6;
                    }
                    matched_9 = (max_distance & 7) + 1;
                    while (matched_9 = matched_9 - 1, matched_9 != 0) {
                      if (ringbuffer[limit2_9 + uVar20] != (uint8_t)*local_e8) {
                        local_d8 = limit2_9;
                        goto LAB_00153fc6;
                      }
                      local_e8 = (ulong *)((long)local_e8 + 1);
                      limit2_9 = limit2_9 + 1;
                    }
                    local_d8 = limit2_9;
LAB_00153fc6:
                    if ((3 < local_d8) && (distance_code < local_d8)) {
                      iVar16 = 0x1f;
                      if (uVar14 != 0) {
                        for (; uVar14 >> iVar16 == 0; iVar16 = iVar16 + -1) {
                        }
                      }
                      uVar20 = (local_d8 * 0x87 + 0x780) - (ulong)(uint)(iVar16 * 0x1e);
                      if (sr2.distance < uVar20) {
                        distance_code = local_d8;
                        sr2.score._0_4_ = 0;
                        sr2.len = (size_t)(ulong)uVar14;
                        sr2.distance = uVar20;
                      }
                    }
                  }
                }
              }
            }
            *(uint8_t **)&(hasher->privat)._H35.hb_common.params.block_bits = ringbuffer_local + 2;
          }
          if ((sr2.distance < sr.distance + 0xaf) &&
             (puVar26 = ringbuffer_local, sr2.score._4_4_ == 0)) break;
          puVar26 = ringbuffer_local + 1;
          pos_end = pos_end + 1;
          sStack_13b0 = distance_code;
          sr.len = sr2.len;
          sr.distance = sr2.distance;
          sr.score = CONCAT44(sr2.score._4_4_,(int)sr2.score);
          if ((sr2.score._4_4_ != 0) ||
             ((cost_diff_lazy._4_4_ = cost_diff_lazy._4_4_ + 1, 3 < cost_diff_lazy._4_4_ ||
              (puVar30 = ringbuffer_local + 9, ringbuffer_local = puVar26, puVar18 <= puVar30))))
          break;
        } while( true );
      }
      ringbuffer_local = puVar26;
      gap = (size_t)(ringbuffer_local + lVar19 + sStack_13b0 * 2);
      local_14b8 = puVar17;
      if (ringbuffer_local + sVar6 < puVar17) {
        local_14b8 = ringbuffer_local + sVar6;
      }
      if (local_14b8 < sr.len) {
LAB_00154419:
        local_1218 = sr.len + 0xf;
      }
      else {
        uVar20 = (sr.len + 3) - (long)*dist_cache;
        uVar21 = (sr.len + 3) - (long)dist_cache[1];
        if (sr.len == (long)*dist_cache) {
          local_1218 = 0;
        }
        else if (sr.len == (long)dist_cache[1]) {
          local_1218 = 1;
        }
        else if (uVar20 < 7) {
          local_1218 = (ulong)(int)(0x9750468 >> ((byte)((uVar20 & 0x3fffffff) << 2) & 0x1f) & 0xf);
        }
        else if (uVar21 < 7) {
          local_1218 = (ulong)(int)(0xfdb1ace >> ((byte)((uVar21 & 0x3fffffff) << 2) & 0x1f) & 0xf);
        }
        else if (sr.len == (long)dist_cache[2]) {
          local_1218 = 2;
        }
        else {
          if (sr.len != (long)dist_cache[3]) goto LAB_00154419;
          local_1218 = 3;
        }
      }
      if ((sr.len <= local_14b8) && (local_1218 != 0)) {
        dist_cache[3] = dist_cache[2];
        dist_cache[2] = dist_cache[1];
        dist_cache[1] = *dist_cache;
        *dist_cache = (int)sr.len;
        iVar16 = (hasher->privat)._H6.num_last_distances_to_check_;
        if (4 < iVar16) {
          iVar12 = *dist_cache;
          dist_cache[4] = iVar12 + -1;
          dist_cache[5] = iVar12 + 1;
          dist_cache[6] = iVar12 + -2;
          dist_cache[7] = iVar12 + 2;
          dist_cache[8] = iVar12 + -3;
          dist_cache[9] = iVar12 + 3;
          if (10 < iVar16) {
            iVar16 = dist_cache[1];
            dist_cache[10] = iVar16 + -1;
            dist_cache[0xb] = iVar16 + 1;
            dist_cache[0xc] = iVar16 + -2;
            dist_cache[0xd] = iVar16 + 2;
            dist_cache[0xe] = iVar16 + -3;
            dist_cache[0xf] = iVar16 + 3;
          }
        }
      }
      uVar15 = (uint32_t)pos_end;
      commands->insert_len_ = uVar15;
      commands->copy_len_ = (uint)sStack_13b0 | (int)sr.score << 0x19;
      uVar14 = (params->dist).num_direct_distance_codes;
      uVar4 = (params->dist).distance_postfix_bits;
      if (local_1218 < (ulong)uVar14 + 0x10) {
        commands->dist_prefix_ = (uint16_t)local_1218;
        commands->dist_extra_ = 0;
      }
      else {
        bVar1 = (byte)uVar4;
        uVar20 = (1L << (bVar1 + 2 & 0x3f)) + ((local_1218 - 0x10) - (ulong)uVar14);
        iVar16 = 0x1f;
        if ((uint)uVar20 != 0) {
          for (; (uint)uVar20 >> iVar16 == 0; iVar16 = iVar16 + -1) {
          }
        }
        bVar28 = (byte)(iVar16 - 1U);
        uVar21 = uVar20 >> (bVar28 & 0x3f) & 1;
        lVar27 = (ulong)(iVar16 - 1U) - (ulong)uVar4;
        commands->dist_prefix_ =
             (short)lVar27 * 0x400 |
             (short)uVar14 + 0x10 + (short)((lVar27 + -1) * 2 + uVar21 << (bVar1 & 0x3f)) +
             ((ushort)uVar20 & (short)(1 << (bVar1 & 0x1f)) - 1U);
        commands->dist_extra_ =
             (uint32_t)(uVar20 - (uVar21 + 2 << (bVar28 & 0x3f)) >> (bVar1 & 0x3f));
      }
      iVar16 = (uint)sStack_13b0 + (int)sr.score;
      uVar20 = (ulong)iVar16;
      if (pos_end < 6) {
        local_1102 = (ushort)pos_end;
      }
      else if (pos_end < 0x82) {
        iVar12 = 0x1f;
        if (uVar15 - 2 != 0) {
          for (; uVar15 - 2 >> iVar12 == 0; iVar12 = iVar12 + -1) {
          }
        }
        local_1102 = (short)(iVar12 + -1) * 2 + (short)(pos_end - 2 >> ((byte)(iVar12 + -1) & 0x3f))
                     + 2;
      }
      else if (pos_end < 0x842) {
        iVar12 = 0x1f;
        if (uVar15 - 0x42 != 0) {
          for (; uVar15 - 0x42 >> iVar12 == 0; iVar12 = iVar12 + -1) {
          }
        }
        local_1102 = (short)iVar12 + 10;
      }
      else if (pos_end < 0x1842) {
        local_1102 = 0x15;
      }
      else if (pos_end < 0x5842) {
        local_1102 = 0x16;
      }
      else {
        local_1102 = 0x17;
      }
      if (uVar20 < 10) {
        local_10da = (short)iVar16 - 2;
      }
      else if (uVar20 < 0x86) {
        iVar12 = 0x1f;
        if (iVar16 - 6U != 0) {
          for (; iVar16 - 6U >> iVar12 == 0; iVar12 = iVar12 + -1) {
          }
        }
        local_10da = (short)(iVar12 + -1) * 2 + (short)(uVar20 - 6 >> ((byte)(iVar12 + -1) & 0x3f))
                     + 4;
      }
      else if (uVar20 < 0x846) {
        iVar12 = 0x1f;
        if (iVar16 - 0x46U != 0) {
          for (; iVar16 - 0x46U >> iVar12 == 0; iVar12 = iVar12 + -1) {
          }
        }
        local_10da = (short)iVar12 + 0xc;
      }
      else {
        local_10da = 0x17;
      }
      local_10b2 = local_10da & 7 | (local_1102 & 7) << 3;
      if ((((commands->dist_prefix_ & 0x3ff) == 0) && (local_1102 < 8)) && (local_10da < 0x10)) {
        if (7 < local_10da) {
          local_10b2 = local_10b2 | 0x40;
        }
      }
      else {
        iVar16 = ((int)(uint)local_10da >> 3) + ((int)(uint)local_1102 >> 3) * 3;
        local_10b2 = (short)iVar16 * 0x40 + 0x40 +
                     ((ushort)(0x520d40 >> ((char)iVar16 * '\x02' & 0x1fU)) & 0xc0) | local_10b2;
      }
      commands->cmd_prefix_ = local_10b2;
      *num_literals = pos_end + *num_literals;
      pos_end = 0;
      range_end = (size_t)(ringbuffer_local + 2);
      local_14d0 = ringbuffer_local + sStack_13b0;
      if (local_1440 <= local_14d0) {
        local_14d0 = local_1440;
      }
      if (sr.len < sStack_13b0 >> 2) {
        local_14e0 = ringbuffer_local + sr.len * -4 + sStack_13b0;
        if (local_14e0 < range_end) {
          local_14e0 = (uint8_t *)range_end;
        }
        if (local_14d0 < local_14e0) {
          local_14e8 = local_14d0;
        }
        else {
          local_14e8 = local_14e0;
        }
        range_end = (size_t)local_14e8;
      }
      for (local_4c8 = (uint8_t *)range_end; local_4c8 < local_14d0; local_4c8 = local_4c8 + 1) {
        puVar7 = (hasher->privat)._H6.num_;
        puVar8 = (hasher->privat)._H6.buckets_;
        uVar20 = (*(ulong *)(ringbuffer + ((ulong)local_4c8 & ringbuffer_mask)) &
                 (hasher->privat)._H6.hash_mask_) * 0x1fe35a7bd3579bd3 >>
                 ((byte)(hasher->privat)._H35.hb.state & 0x3f);
        uVar2 = puVar7[uVar20 & 0xffffffff];
        uVar14 = (hasher->privat)._H6.block_mask_;
        uVar5 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.next_ix + 4);
        puVar7[uVar20 & 0xffffffff] = puVar7[uVar20 & 0xffffffff] + 1;
        puVar8[(ulong)(uVar2 & uVar14) + (ulong)(uint)((int)uVar20 << ((byte)uVar5 & 0x1f))] =
             (uint32_t)local_4c8;
      }
      commands = commands + 1;
      puVar26 = ringbuffer_local + sStack_13b0;
      goto LAB_0014fc36;
    }
    pos_end = pos_end + 1;
    puVar26 = ringbuffer_local + 1;
    if ((gap < puVar26) && (back_refs_size == 0)) {
      if ((uint8_t *)(gap + lVar19 * 4) < puVar26) {
        puVar30 = ringbuffer_local + 0x11;
        local_1500 = puVar18 + -7;
        ringbuffer_local = puVar26;
        if (puVar30 < local_1500) {
          local_1500 = puVar30;
        }
        for (; puVar26 = ringbuffer_local, ringbuffer_local < local_1500;
            ringbuffer_local = ringbuffer_local + 4) {
          puVar7 = (hasher->privat)._H6.num_;
          puVar8 = (hasher->privat)._H6.buckets_;
          uVar20 = (*(ulong *)(ringbuffer + ((ulong)ringbuffer_local & ringbuffer_mask)) &
                   (hasher->privat)._H6.hash_mask_) * 0x1fe35a7bd3579bd3 >>
                   ((byte)(hasher->privat)._H35.hb.state & 0x3f);
          uVar2 = puVar7[uVar20 & 0xffffffff];
          uVar14 = (hasher->privat)._H6.block_mask_;
          uVar5 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.next_ix + 4);
          puVar7[uVar20 & 0xffffffff] = puVar7[uVar20 & 0xffffffff] + 1;
          puVar8[(ulong)(uVar2 & uVar14) + (ulong)(uint)((int)uVar20 << ((byte)uVar5 & 0x1f))] =
               (uint32_t)ringbuffer_local;
          pos_end = pos_end + 4;
        }
      }
      else {
        puVar30 = ringbuffer_local + 9;
        local_1518 = puVar18 + -7;
        ringbuffer_local = puVar26;
        if (puVar30 < local_1518) {
          local_1518 = puVar30;
        }
        for (; puVar26 = ringbuffer_local, ringbuffer_local < local_1518;
            ringbuffer_local = ringbuffer_local + 2) {
          puVar7 = (hasher->privat)._H6.num_;
          puVar8 = (hasher->privat)._H6.buckets_;
          uVar20 = (*(ulong *)(ringbuffer + ((ulong)ringbuffer_local & ringbuffer_mask)) &
                   (hasher->privat)._H6.hash_mask_) * 0x1fe35a7bd3579bd3 >>
                   ((byte)(hasher->privat)._H35.hb.state & 0x3f);
          uVar2 = puVar7[uVar20 & 0xffffffff];
          uVar14 = (hasher->privat)._H6.block_mask_;
          uVar5 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.next_ix + 4);
          puVar7[uVar20 & 0xffffffff] = puVar7[uVar20 & 0xffffffff] + 1;
          puVar8[(ulong)(uVar2 & uVar14) + (ulong)(uint)((int)uVar20 << ((byte)uVar5 & 0x1f))] =
               (uint32_t)ringbuffer_local;
          pos_end = pos_end + 2;
        }
      }
    }
  } while( true );
LAB_0015063d:
  local_888 = local_888 + 1;
  limit2_1 = limit2_1 + 8;
  goto LAB_001505db;
LAB_00150bf7:
  local_8c8 = local_8c8 + 1;
  limit2_2 = limit2_2 + 8;
  goto LAB_00150b95;
LAB_00150231:
  local_620 = local_620 + 1;
  limit2 = limit2 + 8;
  goto LAB_001501cf;
LAB_001511db:
  local_708 = local_708 + 1;
  limit2_3 = limit2_3 + 8;
  goto LAB_00151179;
LAB_00151c0d:
  local_210 = local_210 + 1;
  limit2_4 = limit2_4 + 8;
  goto LAB_00151bab;
LAB_001528b5:
  local_e00 = local_e00 + 1;
  limit2_6 = limit2_6 + 8;
  goto LAB_00152853;
LAB_00152e6f:
  local_e40 = local_e40 + 1;
  limit2_7 = limit2_7 + 8;
  goto LAB_00152e0d;
LAB_001524a9:
  local_b98 = local_b98 + 1;
  limit2_5 = limit2_5 + 8;
  goto LAB_00152447;
LAB_00153453:
  local_c80 = local_c80 + 1;
  limit2_8 = limit2_8 + 8;
  goto LAB_001533f1;
LAB_00153e85:
  local_e8 = local_e8 + 1;
  limit2_9 = limit2_9 + 8;
  goto LAB_00153e23;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}